

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitArray.h
# Opt level: O1

BitArrayView * __thiscall ZXing::BitArrayView::skipBits(BitArrayView *this,int n)

{
  uchar *puVar1;
  out_of_range *this_00;
  
  puVar1 = (this->cur)._M_current + n;
  if (puVar1 <= (this->bits->_bits).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->cur)._M_current = puVar1;
    return this;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"BitArrayView::skipBits() out of range.");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

BitArrayView& skipBits(int n)
	{
		if (cur + n > bits.end())
			throw std::out_of_range("BitArrayView::skipBits() out of range.");
		cur += n;
		return *this;
	}